

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StableBlockVector.hpp
# Opt level: O3

OperatingState __thiscall helics::CommonCore::minFederateState(CommonCore *this)

{
  OperatingState OVar1;
  byte bVar2;
  FedInfo **ppFVar3;
  FedInfo **ppFVar4;
  FedInfo *fed;
  FedInfo *pFVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  FedInfo **ppFVar10;
  
  if ((this->loopFederates).dataStorage.csize == 0) {
    uVar9 = (this->loopFederates).dataStorage.bsize;
    ppFVar3 = (this->loopFederates).dataStorage.dataptr;
    if ((long)(int)uVar9 == 0x20) {
      lVar7 = (long)(this->loopFederates).dataStorage.dataSlotIndex;
      if (ppFVar3 == (FedInfo **)0x0) {
        ppFVar4 = (FedInfo **)
                  &gmlc::containers::
                   StableBlockVector<helics::FedInfo,5u,std::allocator<helics::FedInfo>>::end()::
                   emptyValue;
      }
      else {
        ppFVar4 = ppFVar3 + lVar7 + 1;
      }
      pFVar5 = *ppFVar4;
      uVar9 = 0;
      uVar8 = 0x20;
    }
    else {
      lVar7 = (long)(this->loopFederates).dataStorage.dataSlotIndex;
      ppFVar4 = ppFVar3 + lVar7;
      pFVar5 = *ppFVar4 + (int)uVar9;
      uVar8 = uVar9;
    }
  }
  else {
    ppFVar3 = (this->loopFederates).dataStorage.dataptr;
    pFVar5 = *ppFVar3;
    lVar7 = (long)(this->loopFederates).dataStorage.dataSlotIndex;
    uVar9 = 0;
    ppFVar4 = ppFVar3;
    uVar8 = (this->loopFederates).dataStorage.bsize;
  }
  if (ppFVar3 == (FedInfo **)0x0) {
    ppFVar10 = (FedInfo **)
               &gmlc::containers::
                StableBlockVector<helics::FedInfo,5u,std::allocator<helics::FedInfo>>::end()::
                emptyValue;
  }
  else {
    ppFVar10 = ppFVar3 + lVar7 + 1;
  }
  ppFVar3 = ppFVar3 + lVar7;
  if (uVar8 == 0x20) {
    ppFVar3 = ppFVar10;
  }
  uVar6 = 0;
  if (uVar8 != 0x20) {
    uVar6 = uVar8;
  }
  if ((uVar9 != uVar6) || (OVar1 = DISCONNECTED, ppFVar4 != ppFVar3)) {
    uVar8 = 10;
    do {
      bVar2 = (byte)uVar8;
      uVar8 = uVar8 & 0xff;
      if ((byte)*(uint *)&pFVar5->state < bVar2) {
        uVar8 = *(uint *)&pFVar5->state;
      }
      OVar1 = (OperatingState)uVar8;
      if ((int)uVar9 < 0x1f) {
        pFVar5 = pFVar5 + 1;
        uVar9 = uVar9 + 1;
      }
      else {
        ppFVar4 = ppFVar4 + (ulong)(uVar9 - 0x1f >> 5) + 1;
        uVar9 = uVar9 + 1 & 0x1f;
        pFVar5 = (FedInfo *)((long)&(*ppFVar4)->fed + (ulong)(uVar9 << 4));
      }
    } while ((uVar9 != uVar6) || (ppFVar4 != ppFVar3));
  }
  return OVar1;
}

Assistant:

const_iterator begin() const
        {
            if (csize == 0) {
                return end();
            }
            const X* const* ptr = dataptr;
            return {ptr, 0};
        }